

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

boolean can_pray(boolean praying)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  byte local_1d;
  aligntyp local_18;
  aligntyp local_14;
  int local_10;
  byte local_9;
  int alignment;
  boolean praying_local;
  
  p_aligntyp = u.ualign.type;
  if (level->locations[u.ux][u.uy].typ == '!') {
    if ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 7) == 0) {
      local_14 = -0x80;
      p_aligntyp = local_14;
    }
    else if ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 7) == 4) {
      local_18 = '\x01';
      p_aligntyp = local_18;
    }
    else {
      p_aligntyp = ((byte)(*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4) & 7) - 2;
    }
  }
  p_trouble = in_trouble();
  if ((((youmonst.data)->mflags2 & 0x200) != 0) && (p_aligntyp != -1)) {
    if (praying != '\0') {
      pcVar3 = "neutral";
      if (p_aligntyp != '\0') {
        pcVar3 = "lawful";
      }
      pline("The very idea of praying to a %s god is repugnant to you.",pcVar3);
    }
    return '\0';
  }
  if (praying != '\0') {
    pcVar3 = align_gname(p_aligntyp);
    pline("You begin praying to %s.",pcVar3);
  }
  if ((u.ualign.type == '\0') || ((int)u.ualign.type != -(int)p_aligntyp)) {
    if (u.ualign.type == p_aligntyp) {
      local_10 = u.ualign.record;
    }
    else {
      local_10 = u.ualign.record / 2;
    }
  }
  else {
    local_10 = -u.ualign.record;
  }
  if (p_trouble < 1) {
    if (p_trouble < 0) {
      if (100 < u.ublesscnt) {
LAB_002a6888:
        p_type = 0;
        goto LAB_002a694e;
      }
    }
    else if (0 < u.ublesscnt) goto LAB_002a6888;
  }
  else if (200 < u.ublesscnt) goto LAB_002a6888;
  if ((((int)u.uluck + (int)u.moreluck < 0) || (u.ugangr != 0)) || (local_10 < 0)) {
    p_type = 1;
  }
  else if ((level->locations[u.ux][u.uy].typ == '!') && (u.ualign.type != p_aligntyp)) {
    p_type = 2;
  }
  else {
    p_type = 3;
  }
LAB_002a694e:
  if (((((youmonst.data)->mflags2 & 2) != 0) && (bVar1 = In_hell(&u.uz), bVar1 == '\0')) &&
     ((p_aligntyp == '\x01' || ((p_aligntyp == '\0' && (iVar2 = rn2(10), iVar2 == 0)))))) {
    p_type = -1;
  }
  if (praying == '\0') {
    local_1d = 0;
    if (p_type == 3) {
      bVar1 = In_hell(&u.uz);
      local_1d = bVar1 != '\0' ^ 0xff;
    }
    local_9 = local_1d & 1;
  }
  else {
    local_9 = 1;
  }
  return local_9;
}

Assistant:

boolean can_pray(boolean praying)
{
    int alignment;

    p_aligntyp = on_altar() ? a_align(u.ux,u.uy) : u.ualign.type;
    p_trouble = in_trouble();

    if (is_demon(youmonst.data) && (p_aligntyp != A_CHAOTIC)) {
	if (praying)
	    pline("The very idea of praying to a %s god is repugnant to you.",
		  p_aligntyp ? "lawful" : "neutral");
	return FALSE;
    }

    if (praying)
	pline("You begin praying to %s.", align_gname(p_aligntyp));

    if (u.ualign.type && u.ualign.type == -p_aligntyp)
	alignment = -u.ualign.record;		/* Opposite alignment altar */
    else if (u.ualign.type != p_aligntyp)
	alignment = u.ualign.record / 2;	/* Different alignment altar */
    else alignment = u.ualign.record;

    if ((p_trouble > 0) ? (u.ublesscnt > 200) : /* big trouble */
	(p_trouble < 0) ? (u.ublesscnt > 100) : /* minor difficulties */
	(u.ublesscnt > 0))			/* not in trouble */
	p_type = 0;		/* too soon... */
    else if ((int)Luck < 0 || u.ugangr || alignment < 0)
	p_type = 1;		/* too naughty... */
    else /* alignment >= 0 */ {
	if (on_altar() && u.ualign.type != p_aligntyp)
	    p_type = 2;
	else
	    p_type = 3;
    }

    if (is_undead(youmonst.data) && !Inhell &&
	(p_aligntyp == A_LAWFUL || (p_aligntyp == A_NEUTRAL && !rn2(10))))
	p_type = -1;
    /* Note:  when !praying, the random factor for neutrals makes the
       return value a non-deterministic approximation for enlightenment.
       This case should be uncommon enough to live with... */

    return !praying ? (boolean)(p_type == 3 && !Inhell) : TRUE;
}